

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall
Catch::Generators::RandomFloatingGenerator<long_double>::next
          (RandomFloatingGenerator<long_double> *this)

{
  PImpl *__urng;
  longdouble in_ST0;
  
  __urng = (this->m_pimpl).m_ptr;
  std::uniform_real_distribution<long_double>::operator()(&__urng->dist,&__urng->rng);
  this->m_current_number = in_ST0;
  return true;
}

Assistant:

bool RandomFloatingGenerator<long double>::next() {
            m_current_number = m_pimpl->dist( m_pimpl->rng );
            return true;
        }